

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O2

void ym2413_update_one(void *_chip,UINT32 length,DEV_SMPL **buffers)

{
  OPLL_CH *CH;
  UINT32 *pUVar1;
  byte bVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  INT32 IVar11;
  UINT32 UVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  
  bVar2 = *(byte *)((long)_chip + 0x6a0);
  pDVar3 = *buffers;
  pDVar4 = buffers[1];
  CH = (OPLL_CH *)((long)_chip + 8);
  uVar16 = 0;
  do {
    if (uVar16 == length) {
      return;
    }
    *(undefined8 *)((long)_chip + 0x1780) = 0;
    uVar5 = *(int *)((long)_chip + 0x6ac) + *(int *)((long)_chip + 0x6b0);
    uVar9 = *(int *)((long)_chip + 0x6ac) + 0x2e000000 + *(int *)((long)_chip + 0x6b0);
    if (uVar5 < 0xd2000000) {
      uVar9 = uVar5;
    }
    *(uint *)((long)_chip + 0x6ac) = uVar9;
    *(uint *)((long)_chip + 0x6a4) = (uint)(""[uVar9 >> 0x18] >> 1);
    uVar5 = *(int *)((long)_chip + 0x6b4) + *(int *)((long)_chip + 0x6b8);
    *(uint *)((long)_chip + 0x6b4) = uVar5;
    *(uint *)((long)_chip + 0x6a8) = uVar5 >> 0x18 & 7;
    chan_calc((YM2413 *)_chip,CH);
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0xc0));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x178));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x230));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x2e8));
    chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x3a0));
    if (*(char *)((long)_chip + 0x1769) == '\0') {
      if ((bVar2 & 0x20) == 0) {
        chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x458));
        chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x510));
        chan_calc((YM2413 *)_chip,(OPLL_CH *)((long)_chip + 0x5c8));
      }
      else {
        uVar5 = *(uint *)((long)_chip + 0x6bc);
        uVar9 = *(uint *)((long)_chip + 0x6a4);
        uVar14 = (*(uint *)((long)_chip + 0x4a0) & uVar9) +
                 *(int *)((long)_chip + 0x488) + *(int *)((long)_chip + 0x484);
        iVar6 = *(int *)((long)_chip + 0x474);
        iVar10 = *(int *)((long)_chip + 0x478);
        *(int *)((long)_chip + 0x474) = iVar10;
        *(undefined4 *)((long)_chip + 0x478) = 0;
        if (uVar14 < 0xb0) {
          iVar6 = iVar6 + iVar10;
          if (*(byte *)((long)_chip + 0x470) == 0) {
            iVar6 = 0;
          }
          iVar6 = op_calc1(*(UINT32 *)((long)_chip + 0x468),uVar14,
                           iVar6 << (*(byte *)((long)_chip + 0x470) & 0x1f),
                           *(uint *)((long)_chip + 0x4a8));
          *(int *)((long)_chip + 0x478) = iVar6;
        }
        uVar14 = (*(uint *)((long)_chip + 0x4f4) & uVar9) +
                 *(int *)((long)_chip + 0x4dc) + *(int *)((long)_chip + 0x4d8);
        if ((uVar14 < 0xb0) && (*(char *)((long)_chip + 0x689) == '\0')) {
          iVar6 = op_calc(*(UINT32 *)((long)_chip + 0x4bc),uVar14,iVar10,
                          *(uint *)((long)_chip + 0x4fc));
          *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar6 * 2;
        }
        uVar5 = uVar5 & 1;
        uVar14 = (*(uint *)((long)_chip + 0x558) & uVar9) +
                 *(int *)((long)_chip + 0x540) + *(int *)((long)_chip + 0x53c);
        if ((uVar14 < 0xb0) && (*(char *)((long)_chip + 0x68d) == '\0')) {
          uVar7 = *(uint *)((long)_chip + 0x520);
          uVar7 = (uVar7 >> 0x13 | uVar7 >> 0x17 ^ uVar7 >> 0x12) & 1;
          uVar13 = *(uint *)((long)_chip + 0x62c) & 0x280000;
          iVar6 = 0x234;
          if (uVar13 == 0 && uVar7 == 0) {
            iVar6 = 0xd0;
          }
          iVar10 = iVar6;
          if (uVar5 != 0) {
            iVar6 = 0x34;
            iVar10 = 0x2d0;
          }
          if (uVar13 != 0 || uVar7 != 0) {
            iVar6 = iVar10;
          }
          iVar6 = op_calc(iVar6 << 0x10,uVar14,0,*(uint *)((long)_chip + 0x560));
          *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar6 * 2;
        }
        uVar14 = (*(uint *)((long)_chip + 0x5ac) & uVar9) +
                 *(int *)((long)_chip + 0x594) + *(int *)((long)_chip + 0x590);
        if ((uVar14 < 0xb0) && (*(char *)((long)_chip + 0x68a) == '\0')) {
          iVar6 = op_calc(uVar5 << 0x18 ^ (*(uint *)((long)_chip + 0x520) & 0x1000000) + 0x1000000,
                          uVar14,0,*(uint *)((long)_chip + 0x5b4));
          *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar6 * 2;
        }
        uVar5 = (*(uint *)((long)_chip + 0x610) & uVar9) +
                *(int *)((long)_chip + 0x5f8) + *(int *)((long)_chip + 0x5f4);
        if ((uVar5 < 0xb0) && (*(char *)((long)_chip + 0x68b) == '\0')) {
          iVar6 = op_calc(*(UINT32 *)((long)_chip + 0x5d8),uVar5,0,*(uint *)((long)_chip + 0x618));
          *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar6 * 2;
        }
        uVar5 = (uVar9 & *(uint *)((long)_chip + 0x664)) +
                *(int *)((long)_chip + 0x64c) + *(int *)((long)_chip + 0x648);
        if ((uVar5 < 0xb0) && (*(char *)((long)_chip + 0x68c) == '\0')) {
          uVar9 = *(uint *)((long)_chip + 0x520);
          iVar6 = op_calc((uint)((*(uint *)((long)_chip + 0x62c) & 0x280000) != 0 ||
                                ((uVar9 >> 0x13 | uVar9 >> 0x17 ^ uVar9 >> 0x12) & 1) != 0) << 0x19
                          | 0x1000000,uVar5,0,*(uint *)((long)_chip + 0x66c));
          *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar6 * 2;
        }
      }
    }
    pDVar3[uVar16] = *(int *)((long)_chip + 0x1784) + *(int *)((long)_chip + 0x1780);
    pDVar4[uVar16] = *(int *)((long)_chip + 0x1784) + *(int *)((long)_chip + 0x1780);
    uVar5 = *(int *)((long)_chip + 0x694) + *(int *)((long)_chip + 0x698);
    *(uint *)((long)_chip + 0x694) = uVar5;
    while (*(uint *)((long)_chip + 0x69c) <= uVar5) {
      *(uint *)((long)_chip + 0x694) = uVar5 - *(uint *)((long)_chip + 0x69c);
      *(int *)((long)_chip + 0x690) = *(int *)((long)_chip + 0x690) + 1;
      for (uVar5 = 0; uVar5 != 0x12; uVar5 = uVar5 + 1) {
        uVar9 = uVar5 >> 1;
        uVar14 = uVar5 & 1;
        uVar7 = (uint)CH[uVar9].SLOT[uVar14].state;
        if (uVar7 - 1 < 5) {
          switch(uVar7) {
          case 1:
            if ((uVar14 != 0) || ((0xb < uVar5 && ((*(byte *)((long)_chip + 0x6a0) & 0x20) != 0))))
            {
              if (CH[uVar9].SLOT[uVar14].eg_type == '\0') {
                bVar8 = CH[uVar9].SLOT[uVar14].eg_sh_rs;
                uVar7 = *(uint *)((long)_chip + 0x690);
LAB_0011f599:
                if ((uVar7 & ~(-1 << (bVar8 & 0x1f))) != 0) break;
                uVar7 = uVar7 >> (bVar8 & 0x1f);
                bVar8 = CH[uVar9].SLOT[uVar14].eg_sel_rs;
              }
              else {
                uVar7 = *(uint *)((long)_chip + 0x690);
                if (CH[uVar9].sus != '\0') {
                  bVar8 = CH[uVar9].SLOT[uVar14].eg_sh_rs;
                  goto LAB_0011f599;
                }
                bVar8 = CH[uVar9].SLOT[uVar14].eg_sh_rr;
                if ((uVar7 & ~(-1 << (bVar8 & 0x1f))) != 0) break;
                uVar7 = uVar7 >> (bVar8 & 0x1f);
                bVar8 = CH[uVar9].SLOT[uVar14].eg_sel_rr;
              }
              iVar6 = (uint)""[(ulong)(uVar7 & 7) + (ulong)bVar8] + CH[uVar9].SLOT[uVar14].volume;
              CH[uVar9].SLOT[uVar14].volume = iVar6;
              if (0xfe < iVar6) {
                CH[uVar9].SLOT[uVar14].volume = 0xff;
                CH[uVar9].SLOT[uVar14].state = '\0';
              }
            }
            break;
          case 2:
            if (CH[uVar9].SLOT[uVar14].eg_type == '\0') {
              bVar8 = CH[uVar9].SLOT[uVar14].eg_sh_rr;
              if ((*(uint *)((long)_chip + 0x690) & ~(-1 << (bVar8 & 0x1f))) == 0) {
                IVar11 = (uint)""[(ulong)(*(uint *)((long)_chip + 0x690) >> (bVar8 & 0x1f) & 7) +
                                  (ulong)CH[uVar9].SLOT[uVar14].eg_sel_rr] +
                         CH[uVar9].SLOT[uVar14].volume;
                if (0xfe < IVar11) {
                  IVar11 = 0xff;
                }
                CH[uVar9].SLOT[uVar14].volume = IVar11;
              }
            }
            break;
          case 3:
            bVar8 = CH[uVar9].SLOT[uVar14].eg_sh_dr;
            if (((*(uint *)((long)_chip + 0x690) & ~(-1 << (bVar8 & 0x1f))) == 0) &&
               (iVar6 = (uint)""[(ulong)(*(uint *)((long)_chip + 0x690) >> (bVar8 & 0x1f) & 7) +
                                 (ulong)CH[uVar9].SLOT[uVar14].eg_sel_dr] +
                        CH[uVar9].SLOT[uVar14].volume, CH[uVar9].SLOT[uVar14].volume = iVar6,
               (int)CH[uVar9].SLOT[uVar14].sl <= iVar6)) {
              CH[uVar9].SLOT[uVar14].state = '\x02';
            }
            break;
          case 4:
            bVar8 = CH[uVar9].SLOT[uVar14].eg_sh_ar;
            if ((*(uint *)((long)_chip + 0x690) & ~(-1 << (bVar8 & 0x1f))) == 0) {
              uVar7 = CH[uVar9].SLOT[uVar14].volume;
              iVar6 = (int)((uint)""[(ulong)(*(uint *)((long)_chip + 0x690) >> (bVar8 & 0x1f) & 7) +
                                     (ulong)CH[uVar9].SLOT[uVar14].eg_sel_ar] * ~uVar7) >> 2;
              iVar10 = iVar6 + uVar7;
              CH[uVar9].SLOT[uVar14].volume = iVar10;
              if (iVar10 == 0 || SCARRY4(iVar6,uVar7) != iVar10 < 0) {
                CH[uVar9].SLOT[uVar14].volume = 0;
                CH[uVar9].SLOT[uVar14].state = '\x03';
              }
            }
            break;
          case 5:
            bVar8 = CH[uVar9].SLOT[uVar14].eg_sh_dp;
            if (((*(uint *)((long)_chip + 0x690) & ~(-1 << (bVar8 & 0x1f))) == 0) &&
               (iVar6 = (uint)""[(ulong)(*(uint *)((long)_chip + 0x690) >> (bVar8 & 0x1f) & 7) +
                                 (ulong)CH[uVar9].SLOT[uVar14].eg_sel_dp] +
                        CH[uVar9].SLOT[uVar14].volume, CH[uVar9].SLOT[uVar14].volume = iVar6,
               0xfe < iVar6)) {
              CH[uVar9].SLOT[uVar14].volume = 0xff;
              CH[uVar9].SLOT[uVar14].state = '\x04';
              CH[uVar9].SLOT[uVar14].phase = 0;
            }
          }
        }
      }
      uVar5 = *(uint *)((long)_chip + 0x694);
    }
    for (uVar5 = 0; uVar5 != 0x12; uVar5 = uVar5 + 1) {
      uVar9 = uVar5 >> 1;
      uVar14 = uVar5 & 1;
      if (CH[uVar9].SLOT[uVar14].vib == '\0') {
LAB_0011f65e:
        UVar12 = CH[uVar9].SLOT[uVar14].freq;
      }
      else {
        uVar15 = (ulong)((CH[uVar9].block_fnum >> 3 & 0x38) + *(int *)((long)_chip + 0x6a8));
        if ((0x444444444444eeffU >> (uVar15 & 0x3f) & 1) != 0) goto LAB_0011f65e;
        uVar7 = (int)""[uVar15] + CH[uVar9].block_fnum * 2;
        UVar12 = (uint)CH[uVar9].SLOT[uVar14].mul *
                 (*(uint *)((long)_chip + (ulong)(uVar7 & 0x3ff) * 4 + 0x768) >>
                 (~(byte)(uVar7 >> 10) & 7));
      }
      pUVar1 = &CH[uVar9].SLOT[uVar14].phase;
      *pUVar1 = *pUVar1 + UVar12;
    }
    uVar5 = *(int *)((long)_chip + 0x6c0) + *(int *)((long)_chip + 0x6c4);
    uVar9 = uVar5 >> 0x10;
    *(uint *)((long)_chip + 0x6c0) = uVar5 & 0xffff;
    while (bVar17 = uVar9 != 0, uVar9 = uVar9 - 1, bVar17) {
      uVar14 = *(uint *)((long)_chip + 0x6bc) >> 1;
      uVar5 = uVar14 ^ 0x400181;
      if ((*(uint *)((long)_chip + 0x6bc) & 1) == 0) {
        uVar5 = uVar14;
      }
      *(uint *)((long)_chip + 0x6bc) = uVar5;
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

static void ym2413_update_one(void *_chip, UINT32 length, DEV_SMPL **buffers)
{
	YM2413		*chip  = (YM2413 *)_chip;
	UINT8		rhythm = chip->rhythm&0x20;
	DEV_SMPL	*bufMO = buffers[0];
	DEV_SMPL	*bufRO = buffers[1];

	UINT32 i;

	for( i=0; i < length ; i++ )
	{
		chip->output[0] = 0;
		chip->output[1] = 0;

		advance_lfo(chip);

		/* FM part */
		chan_calc(chip, &chip->P_CH[0]);
		chan_calc(chip, &chip->P_CH[1]);
		chan_calc(chip, &chip->P_CH[2]);
		chan_calc(chip, &chip->P_CH[3]);
		chan_calc(chip, &chip->P_CH[4]);
		chan_calc(chip, &chip->P_CH[5]);

		if (! chip->VRC7_Mode)
		{
			if(!rhythm)
			{
				chan_calc(chip, &chip->P_CH[6]);
				chan_calc(chip, &chip->P_CH[7]);
				chan_calc(chip, &chip->P_CH[8]);
			}
			else        /* Rhythm part */
			{
				rhythm_calc(chip, &chip->P_CH[0], chip->noise_rng & 1 );
			}
		}

		bufMO[i] = chip->output[0] + chip->output[1];
		bufRO[i] = chip->output[0] + chip->output[1];

		advance(chip);
	}
}